

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw_main.cpp
# Opt level: O2

void HandleGLFWError(int error,char *description)

{
  ostream *poVar1;
  LumeviewError *this;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_190,"GLFW ERROR (code ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,error);
  poVar1 = std::operator<<(poVar1,"):\n");
  std::operator<<(poVar1,description);
  this = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  lumeview::LumeviewError::LumeviewError(this,&local_1c0);
  __cxa_throw(this,&lumeview::LumeviewError::typeinfo,lumeview::LumeviewError::~LumeviewError);
}

Assistant:

void HandleGLFWError (int error, const char* description)
{
	THROW ("GLFW ERROR (code " << error << "):\n" <<
	       description);
}